

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O1

void __thiscall ftxui::Screen::Screen(Screen *this,int dimx,int dimy)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_3a;
  allocator_type local_39;
  undefined1 local_38 [32];
  
  (this->stencil).x_min = 0;
  (this->stencil).x_max = dimx + -1;
  (this->stencil).y_min = 0;
  (this->stencil).y_max = dimy + -1;
  this->dimx_ = dimx;
  this->dimy_ = dimy;
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
            ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)local_38,(long)dimx,&local_3a);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::vector(&this->pixels_,(long)dimy,(value_type *)local_38,&local_39);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector
            ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)local_38);
  (this->cursor_).x = 0;
  (this->cursor_).y = 0;
  local_38._0_8_ = (pointer)(local_38 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
  __l._M_len = 1;
  __l._M_array = (iterator)local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->hyperlinks_,__l,(allocator_type *)&local_3a);
  if ((pointer)local_38._0_8_ != (pointer)(local_38 + 0x10)) {
    operator_delete((void *)local_38._0_8_,(ulong)(local_38._16_8_ + 1));
  }
  return;
}

Assistant:

Screen::Screen(int dimx, int dimy)
    : stencil{0, dimx - 1, 0, dimy - 1},
      dimx_(dimx),
      dimy_(dimy),
      pixels_(dimy, std::vector<Pixel>(dimx)) {
#if defined(_WIN32)
  // The placement of this call is a bit weird, however we can assume that
  // anybody who instantiates a Screen object eventually wants to output
  // something to the console.
  // As we require UTF8 for all input/output operations we will just switch to
  // UTF8 encoding here
  SetConsoleOutputCP(CP_UTF8);
  SetConsoleCP(CP_UTF8);
  WindowsEmulateVT100Terminal();
#endif
}